

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitester.cpp
# Opt level: O3

void no_nul_test(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ssize_t sVar2;
  size_t in_RCX;
  long in_FS_OFFSET;
  UniValue val;
  char buf [14];
  UniValue local_88;
  undefined1 local_30 [6];
  undefined2 uStack_2a;
  undefined6 uStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uStack_28 = 0x5f5f5f5d33;
  local_30 = (undefined1  [6])0x2c315b5f5f5f;
  uStack_2a = 0x2c32;
  paVar1 = &local_88.val.field_2;
  local_88.val._M_string_length = 0;
  local_88.val.field_2._M_local_buf[0] = '\0';
  local_88.typ = VNULL;
  local_88.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.val._M_dataplus._M_p = (pointer)paVar1;
  sVar2 = UniValue::read(&local_88,7,local_30 + 3,in_RCX);
  if ((char)sVar2 == '\0') {
    __assert_fail("val.read({buf + 3, 7})",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/univalue/test/unitester.cpp"
                  ,0x9c,"void no_nul_test()");
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_88.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.val._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.val._M_dataplus._M_p,
                    CONCAT71(local_88.val.field_2._M_allocated_capacity._1_7_,
                             local_88.val.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void no_nul_test()
{
    char buf[] = "___[1,2,3]___";
    UniValue val;
    assert(val.read({buf + 3, 7}));
}